

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_schema_info.cpp
# Opt level: O2

string * __thiscall
duckdb::CreateSchemaInfo::ToString_abi_cxx11_(string *__return_storage_ptr__,CreateSchemaInfo *this)

{
  string qualified;
  allocator local_7a;
  allocator local_79;
  string local_78;
  string local_58;
  string local_38;
  
  ::std::__cxx11::string::string
            ((string *)__return_storage_ptr__,anon_var_dwarf_4b0ffdd + 9,(allocator *)&local_38);
  if ((this->super_CreateInfo).temporary == true) {
    ::std::__cxx11::string::string((string *)&local_78,anon_var_dwarf_4b0ffdd + 9,&local_79);
  }
  else {
    ::std::__cxx11::string::string((string *)&local_78,(string *)&(this->super_CreateInfo).catalog);
  }
  ::std::__cxx11::string::string((string *)&local_58,anon_var_dwarf_4b0ffdd + 9,&local_7a);
  ParseInfo::QualifierToString(&local_38,&local_78,&local_58,&(this->super_CreateInfo).schema);
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::~string((string *)&local_78);
  switch((this->super_CreateInfo).on_conflict) {
  case ERROR_ON_CONFLICT:
    ::std::operator+(&local_58,"CREATE SCHEMA ",&local_38);
    ::std::operator+(&local_78,&local_58,";");
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    break;
  case IGNORE_ON_CONFLICT:
    ::std::operator+(&local_58,"CREATE SCHEMA IF NOT EXISTS ",&local_38);
    ::std::operator+(&local_78,&local_58,";");
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    break;
  case REPLACE_ON_CONFLICT:
    ::std::operator+(&local_58,"CREATE OR REPLACE SCHEMA ",&local_38);
    ::std::operator+(&local_78,&local_58,";");
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    break;
  case ALTER_ON_CONFLICT:
    ::std::operator+(&local_58,"CREATE SCHEMA ",&local_38);
    ::std::operator+(&local_78,&local_58," ON CONFLICT INSERT OR REPLACE;");
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    break;
  default:
    goto switchD_0166e421_default;
  }
  ::std::__cxx11::string::~string((string *)&local_78);
  ::std::__cxx11::string::~string((string *)&local_58);
switchD_0166e421_default:
  ::std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

string CreateSchemaInfo::ToString() const {
	string ret = "";
	string qualified = QualifierToString(temporary ? "" : catalog, "", schema);

	switch (on_conflict) {
	case OnCreateConflict::ALTER_ON_CONFLICT: {
		ret += "CREATE SCHEMA " + qualified + " ON CONFLICT INSERT OR REPLACE;";
		break;
	}
	case OnCreateConflict::IGNORE_ON_CONFLICT: {
		ret += "CREATE SCHEMA IF NOT EXISTS " + qualified + ";";
		break;
	}
	case OnCreateConflict::REPLACE_ON_CONFLICT: {
		ret += "CREATE OR REPLACE SCHEMA " + qualified + ";";
		break;
	}
	case OnCreateConflict::ERROR_ON_CONFLICT: {
		ret += "CREATE SCHEMA " + qualified + ";";
		break;
	}
	}
	return ret;
}